

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OscReceivedElements.h
# Opt level: O0

osc_bundle_element_size_t osc::ReceivedPacket::ValidateSize(osc_bundle_element_size_t size)

{
  bool bVar1;
  MalformedPacketException *pMVar2;
  osc_bundle_element_size_t size_local;
  
  bVar1 = IsValidElementSizeValue(size);
  if (!bVar1) {
    pMVar2 = (MalformedPacketException *)__cxa_allocate_exception(0x10);
    MalformedPacketException::MalformedPacketException(pMVar2,"invalid packet size");
    __cxa_throw(pMVar2,&MalformedPacketException::typeinfo,
                MalformedPacketException::~MalformedPacketException);
  }
  if (size == 0) {
    pMVar2 = (MalformedPacketException *)__cxa_allocate_exception(0x10);
    MalformedPacketException::MalformedPacketException(pMVar2,"zero length elements not permitted");
    __cxa_throw(pMVar2,&MalformedPacketException::typeinfo,
                MalformedPacketException::~MalformedPacketException);
  }
  bVar1 = IsMultipleOf4(size);
  if (!bVar1) {
    pMVar2 = (MalformedPacketException *)__cxa_allocate_exception(0x10);
    MalformedPacketException::MalformedPacketException
              (pMVar2,"element size must be multiple of four");
    __cxa_throw(pMVar2,&MalformedPacketException::typeinfo,
                MalformedPacketException::~MalformedPacketException);
  }
  return size;
}

Assistant:

static osc_bundle_element_size_t ValidateSize( osc_bundle_element_size_t size )
    {
        // sanity check integer types declared in OscTypes.h 
        // you'll need to fix OscTypes.h if any of these asserts fail
        assert( sizeof(osc::int32) == 4 );
        assert( sizeof(osc::uint32) == 4 );
        assert( sizeof(osc::int64) == 8 );
        assert( sizeof(osc::uint64) == 8 );

        if( !IsValidElementSizeValue(size) )
            throw MalformedPacketException( "invalid packet size" );

        if( size == 0 )
            throw MalformedPacketException( "zero length elements not permitted" );

        if( !IsMultipleOf4(size) )
            throw MalformedPacketException( "element size must be multiple of four" );

        return size;
    }